

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationSection.cxx
# Opt level: O2

void __thiscall cmDocumentationSection::Append(cmDocumentationSection *this,char *(*data) [2])

{
  char **ppcVar1;
  cmDocumentationEntry cStack_58;
  
  for (ppcVar1 = *data + 1; *ppcVar1 != (char *)0x0; ppcVar1 = ppcVar1 + 2) {
    cmDocumentationEntry::cmDocumentationEntry
              (&cStack_58,(*(char *(*) [2])(ppcVar1 + -1))[0],*ppcVar1);
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
    emplace_back<cmDocumentationEntry>(&this->Entries,&cStack_58);
    cmDocumentationEntry::~cmDocumentationEntry(&cStack_58);
  }
  return;
}

Assistant:

void cmDocumentationSection::Append(const char *data[][2])
{
  int i = 0;
  while(data[i][1])
    {
    this->Entries.push_back(cmDocumentationEntry(data[i][0],
                                                 data[i][1]));
    data += 1;
    }
}